

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ConfidentialValue *
cfd::core::ConfidentialValue::GetCommitment
          (ConfidentialValue *__return_storage_ptr__,Amount *amount,
          ConfidentialAssetId *asset_commitment,BlindFactor *amount_blind_factor)

{
  uint64_t value;
  CfdException *pCVar1;
  allocator local_99;
  undefined1 local_98 [36];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  
  if (asset_commitment->version_ < 2) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0x28d;
    local_98._16_8_ = "GetCommitment";
    logger::warn<>((CfdSourceLocation *)local_98,"asset is not commitment.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_98,"asset is not commitment.",(allocator *)&commitment);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&commitment,0x21,(allocator_type *)local_98);
  ConfidentialAssetId::GetData((ByteData *)local_98,asset_commitment);
  ByteData::GetBytes(&generator,(ByteData *)local_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
             &(amount_blind_factor->data_).data_);
  ByteData256::GetBytes(&vbf,(ByteData256 *)local_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  value = Amount::GetSatoshiValue(amount);
  ret = wally_asset_value_commitment
                  (value,vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   (long)vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                   commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)commitment.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)commitment.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)local_98,&commitment);
    ConfidentialValue(__return_storage_ptr__,(ByteData *)local_98);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_98._0_8_ = "cfdcore_elements_transaction.cpp";
  local_98._8_4_ = 0x298;
  local_98._16_8_ = "GetCommitment";
  logger::warn<int&>((CfdSourceLocation *)local_98,"wally_asset_value_commitment NG[{}].",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_98,"calc amount commitment error.",&local_99);
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_98);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ConfidentialAssetId::HasBlinding() const {
  return (version_ != 0) && (version_ != kConfidentialVersion_1);
}